

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  Item *pIVar4;
  undefined8 uVar5;
  int iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar7;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  undefined8 *puVar10;
  long lVar11;
  cpp_dec_float<100U,_int,_void> *v_00;
  long lVar12;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if (this->theRep == COLUMN) {
    pnVar3 = (this->theFrhs->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar7 = (this->theFrhs->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar7 != pnVar3; pnVar7 = pnVar7 + 1)
    {
      (pnVar7->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar7->m_backend).prec_elem = 0x10;
      (pnVar7->m_backend).data._M_elems[0] = 0;
      (pnVar7->m_backend).data._M_elems[1] = 0;
      (pnVar7->m_backend).data._M_elems[2] = 0;
      (pnVar7->m_backend).data._M_elems[3] = 0;
      (pnVar7->m_backend).data._M_elems[4] = 0;
      (pnVar7->m_backend).data._M_elems[5] = 0;
      (pnVar7->m_backend).data._M_elems[6] = 0;
      (pnVar7->m_backend).data._M_elems[7] = 0;
      (pnVar7->m_backend).data._M_elems[8] = 0;
      (pnVar7->m_backend).data._M_elems[9] = 0;
      (pnVar7->m_backend).data._M_elems[10] = 0;
      (pnVar7->m_backend).data._M_elems[0xb] = 0;
      (pnVar7->m_backend).data._M_elems[0xc] = 0;
      (pnVar7->m_backend).data._M_elems[0xd] = 0;
      (pnVar7->m_backend).data._M_elems[0xe] = 0;
      (pnVar7->m_backend).data._M_elems[0xf] = 0;
      *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x3d) = 0;
    }
    if (this->theType != LEAVE) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7a])(this);
    if (0 < (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        SVar2 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar13];
        if (this->theRep * SVar2 < 1) {
          pVVar8 = &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right;
          switch(SVar2) {
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ESVECS01 ERROR: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_88.data._M_elems._0_8_ = local_88.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"XSVECS01 This should never happen.","");
            *puVar10 = &PTR__SPxException_006a9ee8;
            puVar10[1] = puVar10 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar10 + 1),local_88.data._M_elems._0_8_,
                       local_88.data._M_elems._0_8_ + local_88.data._M_elems._8_8_);
            *puVar10 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          case P_ON_LOWER:
            pVVar8 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left;
          case P_FIXED:
          case P_ON_UPPER:
            pnVar7 = (pVVar8->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12);
            local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12 + 0x10);
            local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12 + 0x20);
            local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12 + 0x30);
            local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar5 = *(undefined8 *)(puVar1 + 2);
            local_d8.data._M_elems._56_5_ = SUB85(uVar5,0);
            local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_d8.exp = *(int *)((long)(&(pnVar7->m_backend).data + 1) + lVar12);
            local_d8.neg = *(bool *)((long)(&(pnVar7->m_backend).data + 1) + lVar12 + 4U);
            local_d8._72_8_ = *(undefined8 *)((long)(&(pnVar7->m_backend).data + 1) + lVar12 + 8U);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)(((this->theFrhs->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar12),&local_d8);
            break;
          case P_FREE:
            break;
          }
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x50;
      } while (lVar13 < (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
  }
  else {
    if (this->theType == ENTER) {
      pnVar3 = (this->theFrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar7 = (this->theFrhs->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar7 != pnVar3; pnVar7 = pnVar7 + 1
          ) {
        (pnVar7->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar7->m_backend).prec_elem = 0x10;
        (pnVar7->m_backend).data._M_elems[0] = 0;
        (pnVar7->m_backend).data._M_elems[1] = 0;
        (pnVar7->m_backend).data._M_elems[2] = 0;
        (pnVar7->m_backend).data._M_elems[3] = 0;
        (pnVar7->m_backend).data._M_elems[4] = 0;
        (pnVar7->m_backend).data._M_elems[5] = 0;
        (pnVar7->m_backend).data._M_elems[6] = 0;
        (pnVar7->m_backend).data._M_elems[7] = 0;
        (pnVar7->m_backend).data._M_elems[8] = 0;
        (pnVar7->m_backend).data._M_elems[9] = 0;
        (pnVar7->m_backend).data._M_elems[10] = 0;
        (pnVar7->m_backend).data._M_elems[0xb] = 0;
        (pnVar7->m_backend).data._M_elems[0xc] = 0;
        (pnVar7->m_backend).data._M_elems[0xd] = 0;
        (pnVar7->m_backend).data._M_elems[0xe] = 0;
        (pnVar7->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x3d) = 0;
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator+=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,
                   &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .object);
      return;
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(this->theFrhs,
                &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object);
    if (0 < (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar12 = 0;
      do {
        SVar2 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar12];
        if (this->theRep * SVar2 < 1) {
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          switch(SVar2) {
          case D_FREE:
            goto switchD_003cc21d_caseD_1;
          case D_ON_UPPER:
          case D_ON_LOWER:
          case D_ON_BOTH:
            pnVar7 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[lVar12].m_backend.data;
            local_88.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar7[lVar12].m_backend.data._M_elems + 2);
            puVar1 = pnVar7[lVar12].m_backend.data._M_elems + 4;
            local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = pnVar7[lVar12].m_backend.data._M_elems + 8;
            local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_88.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = pnVar7[lVar12].m_backend.data._M_elems + 0xc;
            local_88.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar5 = *(undefined8 *)(puVar1 + 2);
            local_88.data._M_elems._56_5_ = SUB85(uVar5,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_88.exp = pnVar7[lVar12].m_backend.exp;
            local_88.neg = pnVar7[lVar12].m_backend.neg;
            local_88.fpclass = pnVar7[lVar12].m_backend.fpclass;
            local_88.prec_elem = pnVar7[lVar12].m_backend.prec_elem;
            break;
          default:
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_88,0.0);
          }
          if (local_88.fpclass != cpp_dec_float_NaN) {
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_d8,0.0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&local_d8);
            if (iVar6 == 0) goto switchD_003cc21d_caseD_1;
          }
          pIVar4 = (this->thevectors->set).theitem;
          iVar6 = (this->thevectors->set).thekey[lVar12].idx;
          lVar13 = (long)pIVar4[iVar6].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar13) {
            pVVar8 = this->theFrhs;
            pIVar4 = pIVar4 + iVar6;
            lVar11 = lVar13 + 1;
            lVar13 = lVar13 * 0x54;
            do {
              pcVar9 = (cpp_dec_float<100U,_int,_void> *)
                       ((long)(pIVar4->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem[-1].val.m_backend.data._M_elems + lVar13);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              v_00 = &local_88;
              if (pcVar9 != &local_d8) {
                local_d8.data._M_elems[0xc] = local_88.data._M_elems[0xc];
                local_d8.data._M_elems[0xd] = local_88.data._M_elems[0xd];
                local_d8.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
                local_d8.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
                local_d8.data._M_elems[8] = local_88.data._M_elems[8];
                local_d8.data._M_elems[9] = local_88.data._M_elems[9];
                local_d8.data._M_elems[10] = local_88.data._M_elems[10];
                local_d8.data._M_elems[0xb] = local_88.data._M_elems[0xb];
                local_d8.data._M_elems[4] = local_88.data._M_elems[4];
                local_d8.data._M_elems[5] = local_88.data._M_elems[5];
                local_d8.data._M_elems[6] = local_88.data._M_elems[6];
                local_d8.data._M_elems[7] = local_88.data._M_elems[7];
                local_d8.data._M_elems[0] = local_88.data._M_elems[0];
                local_d8.data._M_elems[1] = local_88.data._M_elems[1];
                local_d8.data._M_elems[2] = local_88.data._M_elems[2];
                local_d8.data._M_elems[3] = local_88.data._M_elems[3];
                local_d8.exp = local_88.exp;
                local_d8.neg = local_88.neg;
                local_d8.fpclass = local_88.fpclass;
                local_d8.prec_elem = local_88.prec_elem;
                v_00 = pcVar9;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_d8,v_00);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&(pVVar8->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)(&(pIVar4->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem[-1].val + 1) + lVar13)].m_backend,&local_d8);
              lVar11 = lVar11 + -1;
              lVar13 = lVar13 + -0x54;
            } while (1 < lVar11);
          }
        }
switchD_003cc21d_caseD_1:
        lVar12 = lVar12 + 1;
      } while (lVar12 < (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}